

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall
Tokenizer::comparisonShiftOrAssignment
          (Tokenizer *this,char c,TokenType typeComparison,TokenType typeComparisonEq,
          TokenType typeShift,TokenType typeAssign)

{
  Mark MVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  Mark *pMVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  Token local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pMVar5 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar5;
  cVar2 = Stream::peek(&this->stream_);
  if (cVar2 != c) goto LAB_0014f1dd;
  iVar4 = Stream::advance(&this->stream_);
  local_a8.mark = MVar1;
  if (iVar4 == c) {
    iVar4 = Stream::advance(&this->stream_);
    if (iVar4 == 0x3d) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_108,'\x02');
      std::operator+(&local_50,&local_108,"=");
      local_a8.type = typeAssign;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_a8.value,&local_50);
      Token::operator=(&this->token_,&local_a8);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_a8.value);
      this_00 = &local_50;
LAB_0014f101:
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::string::~string((string *)&local_108);
      Stream::advance(&this->stream_);
      goto LAB_0014f1dd;
    }
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct((ulong)local_c8,'\x02');
    local_a8.type = typeShift;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_a8.value,local_c8);
    Token::operator=(&this->token_,&local_a8);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_a8.value);
    this_01 = (string *)local_c8;
  }
  else {
    cVar3 = Stream::peek(&this->stream_);
    if (cVar3 == '=') {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_108,'\x01');
      std::operator+(&local_70,&local_108,"=");
      local_a8.type = typeComparisonEq;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_a8.value,&local_70);
      Token::operator=(&this->token_,&local_a8);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_a8.value);
      this_00 = &local_70;
      goto LAB_0014f101;
    }
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct((ulong)local_e8,'\x01');
    local_a8.type = typeComparison;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_a8.value,local_e8);
    Token::operator=(&this->token_,&local_a8);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_a8.value);
    this_01 = (string *)local_e8;
  }
  std::__cxx11::string::~string(this_01);
LAB_0014f1dd:
  return cVar2 == c;
}

Assistant:

bool Tokenizer::comparisonShiftOrAssignment(char c, TokenType typeComparison, 
    TokenType typeComparisonEq, TokenType typeShift, TokenType typeAssign)
{
  const Mark mark = stream_.getMark();
  if(stream_.peek() == c)
  {
    if(stream_.advance() == c)
    {
      if(stream_.advance() == '=')
      {
        token_ = Token{typeAssign, std::string(2, c) + "=", mark};
        stream_.advance();
      }
      else
        token_ = Token{typeShift, std::string(2, c), mark};
    }
    else if(stream_.peek() == '=')
    {
      token_ = Token{typeComparisonEq, std::string(1, c) + "=", mark};
      stream_.advance();
    }
    else
      token_ = Token{typeComparison, std::string(1, c), mark};
  }
  else
    return false;

  return true;
}